

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbUnfetch(sqlite3_file *pFile,sqlite3_int64 iOfst,void *pPage)

{
  long lVar1;
  long in_RDI;
  MemStore *p;
  
  lVar1 = *(long *)(in_RDI + 8);
  memdbEnter((MemStore *)0x15848f);
  *(int *)(lVar1 + 0x28) = *(int *)(lVar1 + 0x28) + -1;
  memdbLeave((MemStore *)0x1584a7);
  return 0;
}

Assistant:

static int memdbUnfetch(sqlite3_file *pFile, sqlite3_int64 iOfst, void *pPage){
  MemStore *p = ((MemFile*)pFile)->pStore;
  UNUSED_PARAMETER(iOfst);
  UNUSED_PARAMETER(pPage);
  memdbEnter(p);
  p->nMmap--;
  memdbLeave(p);
  return SQLITE_OK;
}